

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlAttrNormalizeSpace(xmlChar *src,xmlChar *dst)

{
  xmlChar *pxVar1;
  byte *pbVar2;
  xmlChar *in_RAX;
  xmlChar *pxVar3;
  
  pxVar3 = src + -1;
  do {
    pxVar1 = pxVar3 + 1;
    in_RAX = (xmlChar *)CONCAT71((int7)((ulong)in_RAX >> 8),*pxVar1);
    pxVar3 = pxVar3 + 1;
  } while (*pxVar1 == ' ');
  do {
    if ((char)in_RAX == ' ') {
      while ((char)in_RAX == ' ') {
        pbVar2 = pxVar3 + 1;
        pxVar3 = pxVar3 + 1;
        in_RAX = (xmlChar *)(ulong)*pbVar2;
      }
      in_RAX = (xmlChar *)((ulong)in_RAX & 0xff);
      if ((int)in_RAX != 0) {
        in_RAX = (xmlChar *)0x20;
        goto LAB_00136077;
      }
    }
    else {
      if (((ulong)in_RAX & 0xff) == 0) {
        *dst = '\0';
        return in_RAX;
      }
      pxVar3 = pxVar3 + 1;
LAB_00136077:
      *dst = (xmlChar)in_RAX;
      dst = dst + 1;
    }
    in_RAX = (xmlChar *)CONCAT71((int7)((ulong)in_RAX >> 8),*pxVar3);
  } while( true );
}

Assistant:

static xmlChar *
xmlAttrNormalizeSpace(const xmlChar *src, xmlChar *dst)
{
    if ((src == NULL) || (dst == NULL))
        return(NULL);

    while (*src == 0x20) src++;
    while (*src != 0) {
	if (*src == 0x20) {
	    while (*src == 0x20) src++;
	    if (*src != 0)
		*dst++ = 0x20;
	} else {
	    *dst++ = *src++;
	}
    }
    *dst = 0;
    if (dst == src)
       return(NULL);
    return(dst);
}